

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O3

SRes SzReadStreamsInfo(CSzAr *p,CSzData *sd,UInt32 numFoldersMax,CBuf *tempBufs,UInt32 numTempBufs,
                      UInt64 *dataOffset,CSubStreamInfo *ssi,ISzAlloc *alloc)

{
  Byte BVar1;
  char cVar2;
  SRes SVar3;
  int iVar4;
  int iVar5;
  UInt64 *pUVar6;
  size_t *psVar7;
  UInt32 *pUVar8;
  Byte *pBVar9;
  ulong uVar10;
  Byte *pBVar11;
  byte *pbVar12;
  uint uVar13;
  CSzData *pCVar14;
  CSzData *pCVar15;
  byte *pbVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  UInt32 UVar20;
  byte bVar21;
  UInt32 UVar22;
  uint uVar23;
  UInt64 UVar24;
  CSzAr *pCVar25;
  size_t sVar26;
  bool bVar27;
  UInt32 index_1;
  UInt64 type;
  UInt32 numCoders;
  UInt32 numFolders;
  UInt64 packSize;
  UInt32 coderOutStreams;
  UInt32 local_11c;
  CSzData local_118;
  CSzData *local_108;
  CSzAr *local_100;
  uint local_f8;
  uint local_f4;
  ulong local_f0;
  UInt64 local_e8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  CSzData *local_d0;
  UInt64 local_c8 [9];
  byte *local_80;
  uint local_78 [18];
  
  (ssi->sdCRCs).Data = (Byte *)0x0;
  (ssi->sdCRCs).Size = 0;
  (ssi->sdSizes).Data = (Byte *)0x0;
  (ssi->sdSizes).Size = 0;
  (ssi->sdNumSubStreams).Data = (Byte *)0x0;
  (ssi->sdNumSubStreams).Size = 0;
  *dataOffset = 0;
  SVar3 = ReadNumber(sd,&local_e8);
  if (SVar3 != 0) {
    return SVar3;
  }
  local_100 = p;
  if (local_e8 == 6) {
    SVar3 = ReadNumber(sd,dataOffset);
    pCVar25 = local_100;
    if (SVar3 != 0) {
      return SVar3;
    }
    SVar3 = SzReadNumber32(sd,&local_100->NumPackStreams);
    if (SVar3 != 0) {
      return SVar3;
    }
    SVar3 = WaitId(sd,9);
    if (SVar3 != 0) {
      return SVar3;
    }
    pUVar6 = (UInt64 *)(*alloc->Alloc)(alloc,(ulong)pCVar25->NumPackStreams * 8 + 8);
    pCVar25->PackPositions = pUVar6;
    if (pUVar6 != (UInt64 *)0x0) {
      uVar10 = (ulong)pCVar25->NumPackStreams;
      if (uVar10 == 0) {
        uVar10 = 0;
        UVar24 = 0;
      }
      else {
        uVar18 = 0;
        UVar24 = 0;
        local_108 = sd;
        do {
          local_100->PackPositions[uVar18] = UVar24;
          SVar3 = ReadNumber(local_108,local_c8);
          if (SVar3 != 0) {
            return SVar3;
          }
          bVar27 = CARRY8(UVar24,local_c8[0]);
          UVar24 = UVar24 + local_c8[0];
          if (bVar27) {
            return 0x10;
          }
          uVar18 = uVar18 + 1;
        } while (uVar10 != uVar18);
        pUVar6 = local_100->PackPositions;
        sd = local_108;
      }
      pUVar6[uVar10] = UVar24;
      SVar3 = ReadNumber(sd,local_c8);
      pCVar25 = local_100;
      if (SVar3 != 0) {
        return SVar3;
      }
      do {
        if (local_c8[0] == 10) {
          iVar4 = SkipBitUi32s(sd,pCVar25->NumPackStreams);
        }
        else {
          if (local_c8[0] == 0) {
            SVar3 = ReadNumber(sd,&local_e8);
            if (SVar3 != 0) {
              return SVar3;
            }
            goto LAB_005cc93f;
          }
          iVar4 = SkipData(sd);
        }
        if (iVar4 != 0) {
          return iVar4;
        }
        SVar3 = ReadNumber(sd,local_c8);
        if (SVar3 != 0) {
          return SVar3;
        }
      } while( true );
    }
  }
  else {
LAB_005cc93f:
    if (local_e8 != 7) {
LAB_005ccfd4:
      if (local_e8 != 8) {
        ssi->NumTotalSubStreams = local_100->NumFolders;
LAB_005cd11b:
        return (uint)(local_e8 != 0) << 2;
      }
      pCVar15 = &ssi->sdNumSubStreams;
      local_c8[0] = 0;
      UVar22 = local_100->NumFolders;
      iVar4 = 0;
      local_108 = (CSzData *)CONCAT44(local_108._4_4_,UVar22);
      local_11c = 0;
      while( true ) {
        SVar3 = ReadNumber(sd,local_c8);
        if (SVar3 != 0) {
          return SVar3;
        }
        if ((local_c8[0] - 9 < 2) || (local_c8[0] == 0)) break;
        if (local_c8[0] == 0xd) {
          pBVar9 = sd->Data;
          pCVar15->Data = pBVar9;
          if ((UInt32)local_108 == 0) {
            UVar22 = 0;
            local_11c = 0;
            pBVar11 = pBVar9;
          }
          else {
            local_11c = 0;
            UVar22 = 0;
            uVar19 = 0;
            do {
              SVar3 = SzReadNumber32(sd,local_78);
              if (SVar3 != 0) {
                return SVar3;
              }
              bVar27 = CARRY4(UVar22,local_78[0]);
              UVar22 = UVar22 + local_78[0];
              if (bVar27) {
                return 4;
              }
              iVar5 = local_78[0] - 1;
              bVar27 = iVar5 != 0;
              if (local_78[0] == 0) {
                iVar5 = 0;
              }
              if (((bVar27) || (pBVar9 = (local_100->FolderCRCs).Defs, pBVar9 == (Byte *)0x0)) ||
                 (-1 < (char)(pBVar9[uVar19 >> 3] << ((byte)uVar19 & 7)))) {
                local_11c = local_11c + local_78[0];
              }
              iVar4 = iVar4 + iVar5;
              uVar19 = uVar19 + 1;
            } while ((UInt32)local_108 != uVar19);
            pBVar9 = pCVar15->Data;
            pBVar11 = sd->Data;
          }
          (ssi->sdNumSubStreams).Size = (long)pBVar11 - (long)pBVar9;
        }
        else {
          SVar3 = SkipData(sd);
          if (SVar3 != 0) {
            return SVar3;
          }
        }
      }
      if ((pCVar15->Data == (Byte *)0x0) &&
         (pbVar12 = (local_100->FolderCRCs).Defs, local_11c = (UInt32)local_108,
         pbVar12 != (byte *)0x0)) {
        iVar5 = 0;
        if ((UInt32)local_108 != 0) {
          uVar19 = 0;
          bVar21 = 0;
          UVar20 = (UInt32)local_108;
          do {
            if (uVar19 == 0) {
              bVar21 = *pbVar12;
              pbVar12 = pbVar12 + 1;
              uVar19 = 8;
            }
            uVar19 = uVar19 - 1;
            iVar5 = iVar5 + (uint)((bVar21 >> (uVar19 & 0x1f) & 1) != 0);
            UVar20 = UVar20 - 1;
          } while (UVar20 != 0);
        }
        local_11c = (UInt32)local_108 - iVar5;
      }
      ssi->NumTotalSubStreams = UVar22;
      ssi->NumSubDigests = local_11c;
      if (local_c8[0] == 9) {
        pbVar12 = sd->Data;
        (ssi->sdSizes).Data = pbVar12;
        uVar10 = sd->Size;
        for (; iVar4 != 0; iVar4 = iVar4 + -1) {
          if (uVar10 == 0) {
            return 0x10;
          }
          uVar18 = uVar10 - 1;
          pbVar16 = pbVar12 + 1;
          bVar21 = *pbVar12;
          if ((char)bVar21 < '\0') {
            if ((bVar21 & 0x40) == 0) {
              if (uVar18 == 0) {
                return 0x10;
              }
              uVar18 = uVar10 - 2;
              pbVar16 = pbVar12 + 2;
            }
            else {
              uVar10 = 2;
              if ((bVar21 & 0x20) != 0) {
                uVar19 = 0x20;
                uVar17 = uVar10;
                do {
                  uVar10 = uVar17 + 1;
                  if (6 < (uint)uVar17) break;
                  uVar19 = uVar19 >> 1;
                  uVar17 = uVar10;
                } while ((uVar19 & bVar21) != 0);
              }
              bVar27 = uVar18 < uVar10;
              uVar18 = uVar18 - uVar10;
              if (bVar27) {
                return 0x10;
              }
              pbVar16 = pbVar16 + uVar10;
            }
          }
          pbVar12 = pbVar16;
          uVar10 = uVar18;
        }
        sd->Data = pbVar12;
        sd->Size = uVar10;
        (ssi->sdSizes).Size = (long)pbVar12 - (long)(ssi->sdSizes).Data;
        SVar3 = ReadNumber(sd,local_c8);
        if (SVar3 != 0) {
          return SVar3;
        }
      }
      do {
        if (local_c8[0] == 10) {
          (ssi->sdCRCs).Data = sd->Data;
          SVar3 = SkipBitUi32s(sd,local_11c);
          if (SVar3 != 0) {
            return SVar3;
          }
          (ssi->sdCRCs).Size = (long)sd->Data - (long)(ssi->sdCRCs).Data;
        }
        else {
          if (local_c8[0] == 0) {
            SVar3 = ReadNumber(sd,&local_e8);
            if (SVar3 != 0) {
              return SVar3;
            }
            goto LAB_005cd11b;
          }
          SVar3 = SkipData(sd);
          if (SVar3 != 0) {
            return SVar3;
          }
        }
        SVar3 = ReadNumber(sd,local_c8);
        if (SVar3 != 0) {
          return SVar3;
        }
      } while( true );
    }
    SVar3 = WaitId(sd,0xb);
    pCVar25 = local_100;
    if (SVar3 != 0) {
      return SVar3;
    }
    SVar3 = SzReadNumber32(sd,&local_d4);
    if (SVar3 != 0) {
      return SVar3;
    }
    local_108 = (CSzData *)(ulong)local_d4;
    if (numFoldersMax < local_d4) {
      return 4;
    }
    pCVar25->NumFolders = local_d4;
    if (sd->Size == 0) {
      return 0x10;
    }
    sd->Size = sd->Size - 1;
    pBVar9 = sd->Data;
    sd->Data = pBVar9 + 1;
    BVar1 = *pBVar9;
    if (BVar1 == '\0') {
      local_118.Data = sd->Data;
      local_118.Size = sd->Size;
    }
    else {
      SVar3 = SzReadNumber32(sd,(UInt32 *)local_c8);
      if (SVar3 != 0) {
        return SVar3;
      }
      if (numTempBufs <= (uint)local_c8[0]) {
        return 0x10;
      }
      local_118.Data = tempBufs[local_c8[0] & 0xffffffff].data;
      local_118.Size = tempBufs[local_c8[0] & 0xffffffff].size;
    }
    pCVar15 = local_108;
    psVar7 = (size_t *)(*alloc->Alloc)(alloc,(long)local_108 * 8 + 8);
    pCVar25->FoCodersOffsets = psVar7;
    if (psVar7 != (size_t *)0x0) {
      sVar26 = (long)pCVar15 * 4 + 4;
      pUVar8 = (UInt32 *)(*alloc->Alloc)(alloc,sVar26);
      pCVar25->FoStartPackStreamIndex = pUVar8;
      if (pUVar8 != (UInt32 *)0x0) {
        pUVar8 = (UInt32 *)(*alloc->Alloc)(alloc,sVar26);
        pCVar15 = local_108;
        pCVar25->FoToCoderUnpackSizes = pUVar8;
        if (pUVar8 != (UInt32 *)0x0) {
          pBVar9 = (Byte *)(*alloc->Alloc)(alloc,(size_t)local_108);
          pCVar25->FoToMainUnpackSizeIndex = pBVar9;
          if (pBVar9 != (Byte *)0x0) {
            if ((int)pCVar15 == 0) {
              uVar23 = 0;
              pbVar12 = local_118.Data;
              uVar19 = 0;
            }
            else {
              pCVar14 = (CSzData *)0x0;
              local_dc = 0;
              local_f4 = 0;
              local_80 = local_118.Data;
              do {
                pCVar25->FoCodersOffsets[(long)pCVar14] = (long)local_118.Data - (long)local_80;
                local_d0 = pCVar14;
                SVar3 = SzReadNumber32(&local_118,&local_d8);
                if (SVar3 != 0) {
                  return SVar3;
                }
                local_f0 = (ulong)local_d8;
                if (local_d8 - 0x41 < 0xffffffc0) {
                  return 4;
                }
                uVar23 = 0;
                uVar19 = local_d8;
                do {
                  if (local_118.Size == 0) {
                    return 0x10;
                  }
                  bVar21 = *local_118.Data;
                  if (0x3f < bVar21) {
                    return 4;
                  }
                  uVar13 = bVar21 & 0xf;
                  uVar10 = (ulong)uVar13;
                  if (8 < uVar13) {
                    return 4;
                  }
                  uVar18 = local_118.Size - 1;
                  local_118.Size = uVar18 - uVar10;
                  if (uVar18 < uVar10) {
                    return 0x10;
                  }
                  local_118.Data = local_118.Data + uVar10 + 1;
                  local_c8[0] = CONCAT44(local_c8[0]._4_4_,1);
                  uVar13 = 1;
                  if ((bVar21 & 0x10) != 0) {
                    SVar3 = SzReadNumber32(&local_118,(UInt32 *)local_c8);
                    if (SVar3 != 0) {
                      return SVar3;
                    }
                    SVar3 = SzReadNumber32(&local_118,local_78);
                    if (SVar3 != 0) {
                      return SVar3;
                    }
                    if (0x40 < (uint)local_c8[0]) {
                      return 4;
                    }
                    uVar13 = (uint)local_c8[0];
                    if (local_78[0] != 1) {
                      return 4;
                    }
                  }
                  if (0x1f < bVar21) {
                    SVar3 = SzReadNumber32(&local_118,local_78);
                    if (SVar3 != 0) {
                      return SVar3;
                    }
                    uVar10 = (ulong)local_78[0];
                    bVar27 = local_118.Size < uVar10;
                    local_118.Size = local_118.Size - uVar10;
                    if (bVar27) {
                      return 0x10;
                    }
                    local_118.Data = local_118.Data + uVar10;
                  }
                  uVar23 = uVar23 + uVar13;
                  uVar19 = uVar19 - 1;
                } while (uVar19 != 0);
                if (uVar23 == 1 && (int)local_f0 == 1) {
                  uVar10 = 0;
                  uVar13 = 1;
                }
                else {
                  uVar19 = (int)local_f0 - 1;
                  uVar13 = uVar23 - uVar19;
                  if (uVar23 < uVar19) {
                    return 0x10;
                  }
                  if (0x40 < uVar23) {
                    return 4;
                  }
                  if (uVar23 != 0) {
                    memset(local_c8,0,(ulong)uVar23);
                  }
                  memset(local_78,0,local_f0);
                  if (uVar19 != 0) {
                    uVar19 = 1;
                    do {
                      SVar3 = SzReadNumber32(&local_118,&local_f8);
                      if (SVar3 != 0) {
                        return SVar3;
                      }
                      if (uVar23 <= local_f8) {
                        return 0x10;
                      }
                      if (*(char *)((long)local_c8 + (ulong)local_f8) != '\0') {
                        return 0x10;
                      }
                      *(undefined1 *)((long)local_c8 + (ulong)local_f8) = 1;
                      SVar3 = SzReadNumber32(&local_118,&local_f8);
                      if (SVar3 != 0) {
                        return SVar3;
                      }
                      if ((uint)local_f0 <= local_f8) {
                        return 0x10;
                      }
                      cVar2 = *(char *)((long)local_78 + (ulong)local_f8);
                      *(char *)((long)local_78 + (ulong)local_f8) = cVar2 + (cVar2 == '\0');
                      if (cVar2 != '\0') {
                        return 0x10;
                      }
                      uVar19 = uVar19 + 1;
                    } while ((uint)local_f0 != uVar19);
                  }
                  uVar19 = uVar13;
                  if (1 < uVar13) {
                    do {
                      SVar3 = SzReadNumber32(&local_118,&local_f8);
                      if (SVar3 != 0) {
                        return SVar3;
                      }
                      if (uVar23 <= local_f8) {
                        return 0x10;
                      }
                      cVar2 = *(char *)((long)local_c8 + (ulong)local_f8);
                      *(char *)((long)local_c8 + (ulong)local_f8) = cVar2 + (cVar2 == '\0');
                      if (cVar2 != '\0') {
                        return 0x10;
                      }
                      uVar19 = uVar19 - 1;
                    } while (uVar19 != 0);
                  }
                  uVar10 = 0;
                  while (*(char *)((long)local_78 + uVar10) != '\0') {
                    uVar10 = uVar10 + 1;
                    if (local_f0 == uVar10) {
                      return 0x10;
                    }
                  }
                  if ((uint)local_f0 == (int)uVar10) {
                    return 0x10;
                  }
                }
                local_100->FoStartPackStreamIndex[(long)local_d0] = local_f4;
                local_100->FoToCoderUnpackSizes[(long)local_d0] = local_dc;
                local_100->FoToMainUnpackSizeIndex[(long)local_d0] = (Byte)uVar10;
                uVar23 = local_dc + (uint)local_f0;
                if (CARRY4(local_dc,(uint)local_f0)) {
                  return 4;
                }
                bVar27 = CARRY4(local_f4,uVar13);
                local_f4 = local_f4 + uVar13;
                if (bVar27) {
                  return 4;
                }
                if (local_100->NumPackStreams < local_f4) {
                  return 0x10;
                }
                pCVar14 = (CSzData *)((long)&local_d0->Data + 1);
                pCVar15 = local_108;
                pbVar12 = local_80;
                pCVar25 = local_100;
                local_dc = uVar23;
                uVar19 = local_f4;
              } while (pCVar14 != local_108);
            }
            pCVar25->FoToCoderUnpackSizes[(long)pCVar15] = uVar23;
            sVar26 = (long)local_118.Data - (long)pbVar12;
            pCVar25->FoStartPackStreamIndex[(long)pCVar15] = uVar19;
            pCVar25->FoCodersOffsets[(long)pCVar15] = sVar26;
            if (local_118.Data == pbVar12) {
              pCVar25 = (CSzAr *)0x0;
            }
            else {
              pBVar9 = (Byte *)(*alloc->Alloc)(alloc,sVar26);
              pCVar25->CodersData = pBVar9;
              if (pBVar9 == (Byte *)0x0) {
                return 2;
              }
              memcpy(pBVar9,pbVar12,sVar26);
              pCVar25 = local_100;
            }
            if (BVar1 != '\0') {
              if (local_118.Size != 0) {
                return 0x10;
              }
              local_118.Data = sd->Data;
              local_118.Size = sd->Size;
            }
            SVar3 = WaitId(&local_118,0xc);
            if (SVar3 != 0) {
              return SVar3;
            }
            if (uVar23 == 0) {
              pCVar25->CoderUnpackSizes = (UInt64 *)0x0;
            }
            else {
              pUVar6 = (UInt64 *)(*alloc->Alloc)(alloc,(ulong)uVar23 << 3);
              pCVar25->CoderUnpackSizes = pUVar6;
              if (pUVar6 == (UInt64 *)0x0) {
                return 2;
              }
              sVar26 = 0;
              do {
                SVar3 = ReadNumber(&local_118,(UInt64 *)((long)pCVar25->CoderUnpackSizes + sVar26));
                if (SVar3 != 0) {
                  return SVar3;
                }
                sVar26 = sVar26 + 8;
              } while ((ulong)uVar23 << 3 != sVar26);
            }
            SVar3 = ReadNumber(&local_118,local_c8);
            if (SVar3 != 0) {
              return SVar3;
            }
            do {
              if (local_c8[0] == 10) {
                iVar4 = ReadBitUi32s(&local_118,local_d4,&pCVar25->FolderCRCs,alloc);
              }
              else {
                if (local_c8[0] == 0) {
                  sd->Data = local_118.Data;
                  sd->Size = local_118.Size;
                  SVar3 = ReadNumber(sd,&local_e8);
                  if (SVar3 != 0) {
                    return SVar3;
                  }
                  goto LAB_005ccfd4;
                }
                iVar4 = SkipData(&local_118);
              }
              if (iVar4 != 0) {
                return iVar4;
              }
              SVar3 = ReadNumber(&local_118,local_c8);
              if (SVar3 != 0) {
                return SVar3;
              }
            } while( true );
          }
        }
      }
    }
  }
  return 2;
}

Assistant:

static SRes SzReadStreamsInfo(CSzAr *p,
    CSzData *sd,
    UInt32 numFoldersMax, const CBuf *tempBufs, UInt32 numTempBufs,
    UInt64 *dataOffset,
    CSubStreamInfo *ssi,
    ISzAlloc *alloc)
{
  UInt64 type;

  SzData_Clear(&ssi->sdSizes);
  SzData_Clear(&ssi->sdCRCs);
  SzData_Clear(&ssi->sdNumSubStreams);

  *dataOffset = 0;
  RINOK(ReadID(sd, &type));
  if (type == k7zIdPackInfo)
  {
    RINOK(ReadNumber(sd, dataOffset));
    RINOK(ReadPackInfo(p, sd, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdUnpackInfo)
  {
    RINOK(ReadUnpackInfo(p, sd, numFoldersMax, tempBufs, numTempBufs, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdSubStreamsInfo)
  {
    RINOK(ReadSubStreamsInfo(p, sd, ssi));
    RINOK(ReadID(sd, &type));
  }
  else
  {
    ssi->NumTotalSubStreams = p->NumFolders;
    // ssi->NumSubDigests = 0;
  }

  return (type == k7zIdEnd ? SZ_OK : SZ_ERROR_UNSUPPORTED);
}